

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> __thiscall
wallet::CWallet::GetSolvingProvider(CWallet *this,CScript *script,SignatureData *sigdata)

{
  bool bVar1;
  uint uVar2;
  const_reference ppSVar3;
  LegacyScriptPubKeyMan *pLVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  unordered_map<CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  LegacyScriptPubKeyMan *spkm;
  const_iterator *it;
  key_type *in_stack_ffffffffffffff88;
  _Head_base<0UL,_SigningProvider_*,_false> this_00;
  CWallet *this_01;
  _Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
  local_10;
  Notifications local_8;
  
  local_8._vptr_Notifications = *(_func_int ***)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl = (SigningProvider *)in_RDI;
  local_10._M_cur =
       (__node_type *)
       std::
       unordered_map<CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>_>_>
       ::find(in_RDI,in_stack_ffffffffffffff88);
  this_01 = (CWallet *)&stack0xfffffffffffffff0;
  std::
  unordered_map<CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>_>_>
  ::end(in_RDI);
  bVar1 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
                      *)this_00._M_head_impl,
                     (_Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
                      *)in_RDI);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pLVar4 = GetLegacyScriptPubKeyMan(this_01);
    if ((pLVar4 == (LegacyScriptPubKeyMan *)0x0) ||
       (uVar2 = (*(pLVar4->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x16])
                          (pLVar4,in_RDX,in_RCX), (uVar2 & 1) == 0)) {
      std::unique_ptr<SigningProvider,std::default_delete<SigningProvider>>::
      unique_ptr<std::default_delete<SigningProvider>,void>
                ((unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> *)
                 in_stack_ffffffffffffff88,(nullptr_t)0x1bc6f4);
    }
    else {
      (*(pLVar4->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x15])
                (in_RDI,pLVar4,in_RDX);
    }
  }
  else {
    std::__detail::
    _Node_const_iterator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_false,_true>
    ::operator->((_Node_const_iterator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_false,_true>
                  *)in_stack_ffffffffffffff88);
    ppSVar3 = std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>::at
                        ((vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                          *)this_00._M_head_impl,(size_type)in_RDI);
    (*(*ppSVar3)->_vptr_ScriptPubKeyMan[0x16])(*ppSVar3,in_RDX,in_RCX);
    inline_assertion_check<false,bool>
              ((bool *)this_01,in_RSI,(int)((ulong)this_00._M_head_impl >> 0x20),(char *)in_RDI,
               (char *)in_stack_ffffffffffffff88);
    std::__detail::
    _Node_const_iterator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_false,_true>
    ::operator->((_Node_const_iterator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_false,_true>
                  *)in_stack_ffffffffffffff88);
    ppSVar3 = std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>::at
                        ((vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                          *)this_00._M_head_impl,(size_type)in_RDI);
    (*(*ppSVar3)->_vptr_ScriptPubKeyMan[0x15])(in_RDI,*ppSVar3,in_RDX);
  }
  if (*(_func_int ***)(in_FS_OFFSET + 0x28) != local_8._vptr_Notifications) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<SigningProvider,_std::default_delete<SigningProvider>,_true,_true>)
         (tuple<SigningProvider_*,_std::default_delete<SigningProvider>_>)this_00._M_head_impl;
}

Assistant:

std::unique_ptr<SigningProvider> CWallet::GetSolvingProvider(const CScript& script, SignatureData& sigdata) const
{
    // Search the cache for relevant SPKMs instead of iterating m_spk_managers
    const auto& it = m_cached_spks.find(script);
    if (it != m_cached_spks.end()) {
        // All spkms for a given script must already be able to make a SigningProvider for the script, so just return the first one.
        Assume(it->second.at(0)->CanProvide(script, sigdata));
        return it->second.at(0)->GetSolvingProvider(script);
    }

    // Legacy wallet
    LegacyScriptPubKeyMan* spkm = GetLegacyScriptPubKeyMan();
    if (spkm && spkm->CanProvide(script, sigdata)) return spkm->GetSolvingProvider(script);

    return nullptr;
}